

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O3

void line_tick(t_line_conflict *x)

{
  _outlet *x_00;
  double dVar1;
  double dVar2;
  float fVar3;
  
  dVar1 = clock_getsystime();
  dVar2 = clock_gettimesince(x->x_targettime);
  x_00 = (x->x_obj).te_outlet;
  if (-1e-09 < dVar2) {
    outlet_float(x_00,x->x_targetval);
    return;
  }
  outlet_float(x_00,(float)((double)(x->x_targetval - x->x_setval) *
                            (dVar1 - x->x_prevtime) * x->x_1overtimediff + (double)x->x_setval));
  fVar3 = x->x_grain;
  if (fVar3 <= 0.0) {
    x->x_grain = 20.0;
    fVar3 = 20.0;
  }
  dVar1 = -dVar2;
  if ((double)fVar3 <= -dVar2) {
    dVar1 = (double)fVar3;
  }
  clock_delay(x->x_clock,dVar1);
  return;
}

Assistant:

static void line_tick(t_line *x)
{
    double timenow = clock_getsystime();
    double msectogo = - clock_gettimesince(x->x_targettime);
    if (msectogo < 1E-9)
    {
        outlet_float(x->x_obj.ob_outlet, x->x_targetval);
    }
    else
    {
        outlet_float(x->x_obj.ob_outlet,
            x->x_setval + x->x_1overtimediff * (timenow - x->x_prevtime)
                * (x->x_targetval - x->x_setval));
        if (x->x_grain <= 0)
            x->x_grain = DEFAULTLINEGRAIN;
        clock_delay(x->x_clock,
            (x->x_grain > msectogo ? msectogo : x->x_grain));
    }
}